

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmakeRegenTest.cpp
# Opt level: O0

void __thiscall TestMakeCmakeComment_Multiline::Run(TestMakeCmakeComment_Multiline *this)

{
  __type _Var1;
  runtime_error *this_00;
  __type v;
  string comment;
  string expectedComment;
  string contents;
  string *contents_00;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  string local_88 [39];
  allocator local_61;
  string local_60 [55];
  undefined1 local_29 [41];
  
  contents_00 = (string *)local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_29 + 1),"Multiple\nlines\nin\ncomment",(allocator *)contents_00);
  std::allocator<char>::~allocator((allocator<char> *)local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"# Multiple\n# lines\n# in\n# comment\n",&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__cxx11::string::string(local_88);
  MakeCmakeComment((string *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                   contents_00);
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),contents_00)
  ;
  if (!_Var1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed: comment == expectedComment");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string((string *)(local_29 + 1));
  return;
}

Assistant:

TEST(MakeCmakeComment_Multiline) {
  const std::string contents("Multiple\n"
                             "lines\n"
                             "in\n"
                             "comment");
  const std::string expectedComment("# Multiple\n"
                                    "# lines\n"
                                    "# in\n"
                                    "# comment\n");

  std::string comment;
  MakeCmakeComment(comment, contents);
  ASSERT(comment == expectedComment);
}